

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.cc
# Opt level: O0

void matras_alloc_range_overflow_test(void)

{
  void *pvVar1;
  void *data;
  size_t i;
  matras mat;
  matras_id_t id;
  size_t max_capacity;
  size_t range_count;
  
  _space(_stdout);
  printf("# *** %s ***\n","matras_alloc_range_overflow_test");
  plan(2);
  matras_create((matras *)&i,0x10,&pta_allocator,(matras_stats *)0x0);
  data = (void *)0x0;
  while( true ) {
    if ((void *)0xff < data) {
      pvVar1 = matras_alloc_range((matras *)&i,(matras_id_t *)((long)&mat.stats + 4),4);
      _ok((uint)(pvVar1 == (void *)0x0),"matras_alloc_range(&mat, &id, range_count) == NULL",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x172
          ,"line %d");
      _ok((uint)(mat.stats._4_4_ == 0xfc),"id == max_capacity - range_count",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x173
          ,"line %d");
      matras_destroy((matras *)&i);
      _space(_stdout);
      printf("# *** %s: done ***\n","matras_alloc_range_overflow_test");
      check_plan();
      return;
    }
    pvVar1 = matras_alloc_range((matras *)&i,(matras_id_t *)((long)&mat.stats + 4),4);
    if (pvVar1 == (void *)0x0) break;
    if ((void *)(ulong)mat.stats._4_4_ != data) {
      fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n","id == i","false",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",
              0x16f,"matras_alloc_range_overflow_test");
      exit(-1);
    }
    data = (void *)((long)data + 4);
  }
  fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n","data != NULL","false",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x16e
          ,"matras_alloc_range_overflow_test");
  exit(-1);
}

Assistant:

void
matras_alloc_range_overflow_test()
{
	header();
	plan(2);

	const size_t range_count = 4;
	size_t max_capacity = PROV_EXTENT_SIZE / PROV_BLOCK_SIZE;
	max_capacity *= PROV_EXTENT_SIZE / sizeof(void *);
	max_capacity *= PROV_EXTENT_SIZE / sizeof(void *);

	matras_id_t id;
	struct matras mat;
	matras_create(&mat, PROV_BLOCK_SIZE, &pta_allocator, NULL);
	for (size_t i = 0; i < max_capacity; i += range_count) {
		void *data = matras_alloc_range(&mat, &id, range_count);
		fail_unless(data != NULL);
		fail_unless(id == i);
	}
	/* Try to exceed the maximum capacity. */
	ok(matras_alloc_range(&mat, &id, range_count) == NULL);
	ok(id == max_capacity - range_count);
	matras_destroy(&mat);

	footer();
	check_plan();
}